

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawPartialWarpedDecal
          (PixelGameEngine *this,Decal *decal,vf2d *pos,vf2d *source_pos,vf2d *source_size,
          Pixel *tint)

{
  initializer_list<olc::v2d_generic<float>_> __l;
  initializer_list<olc::v2d_generic<float>_> __l_00;
  initializer_list<float> __l_01;
  initializer_list<olc::Pixel> __l_02;
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  float fVar4;
  float fVar5;
  float local_1f0;
  value_type local_1d4;
  float local_1cc;
  int local_1c8;
  float q;
  int i_1;
  int local_1bc;
  float fStack_1b8;
  int i;
  float d [4];
  v2d_generic<float> local_1a0;
  olc local_198 [8];
  v2d_generic<float> local_190;
  float local_188;
  float local_184;
  float sn;
  float rn;
  v2d_generic<float> local_178;
  v2d_generic<float> local_170;
  v2d_generic<float> local_168;
  iterator local_160;
  undefined8 local_158;
  v2d_generic<float> local_14c;
  v2d_generic<float> local_144;
  vf2d uvbr;
  vf2d uvtl;
  float rd;
  vf2d center;
  v2d_generic<float> local_120;
  v2d_generic<float> local_118;
  v2d_generic<float> local_110;
  iterator local_108;
  undefined8 local_100;
  float local_f8 [4];
  iterator local_e8;
  undefined8 local_e0;
  anon_union_4_2_12391da5_for_Pixel_0 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  anon_union_4_2_12391da5_for_Pixel_0 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [8];
  DecalInstance di;
  Pixel *tint_local;
  vf2d *source_size_local;
  vf2d *source_pos_local;
  vf2d *pos_local;
  Decal *decal_local;
  PixelGameEngine *this_local;
  
  di._104_8_ = tint;
  DecalInstance::DecalInstance((DecalInstance *)local_a8);
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  local_c8 = *(anon_union_4_2_12391da5_for_Pixel_0 *)di._104_8_;
  local_c4 = *(undefined4 *)di._104_8_;
  local_c0 = *(undefined4 *)di._104_8_;
  local_bc = *(undefined4 *)di._104_8_;
  local_b8 = &local_c8;
  local_b0 = 4;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)local_b8;
  local_a8 = (undefined1  [8])decal;
  std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator=
            ((vector<olc::Pixel,_std::allocator<olc::Pixel>_> *)
             &di.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,__l_02);
  local_f8[0] = 1.0;
  local_f8[1] = 1.0;
  local_f8[2] = 1.0;
  local_f8[3] = 1.0;
  local_e8 = local_f8;
  local_e0 = 4;
  __l_01._M_len = 4;
  __l_01._M_array = local_e8;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &di.uv.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_01);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)&di,4);
  v2d_generic<float>::v2d_generic(&center,0.0,0.0);
  v2d_generic<float>::v2d_generic(&local_120,0.0,1.0);
  v2d_generic<float>::v2d_generic(&local_118,1.0,1.0);
  v2d_generic<float>::v2d_generic(&local_110,1.0,0.0);
  local_108 = &center;
  local_100 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_108;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::operator=
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             &di.pos.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_00);
  v2d_generic<float>::v2d_generic((v2d_generic<float> *)&uvtl.y);
  uvtl.x = (pos[2].x - pos->x) * (pos[3].y - pos[1].y) +
           -((pos[3].x - pos[1].x) * (pos[2].y - pos->y));
  if ((uvtl.x != 0.0) || (NAN(uvtl.x))) {
    v2d_generic<float>::operator*(&uvbr,source_pos);
    v2d_generic<float>::operator*(&local_14c,source_size);
    v2d_generic<float>::operator+(&local_144,&uvbr);
    v2d_generic<float>::v2d_generic((v2d_generic<float> *)&sn,uvbr.x,uvbr.y);
    v2d_generic<float>::v2d_generic(&local_178,uvbr.x,local_144.y);
    v2d_generic<float>::v2d_generic(&local_170,local_144.x,local_144.y);
    v2d_generic<float>::v2d_generic(&local_168,local_144.x,uvbr.y);
    local_160 = (iterator)&sn;
    local_158 = 4;
    __l._M_len = 4;
    __l._M_array = local_160;
    std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::operator=
              ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
               &di.pos.
                super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,__l);
    uvtl.x = 1.0 / uvtl.x;
    local_184 = ((pos[3].x - pos[1].x) * (pos->y - pos[1].y) +
                -((pos[3].y - pos[1].y) * (pos->x - pos[1].x))) * uvtl.x;
    local_188 = ((pos[2].x - pos->x) * (pos->y - pos[1].y) +
                -((pos[2].y - pos->y) * (pos->x - pos[1].x))) * uvtl.x;
    if ((0.0 <= local_184) && (((local_184 <= 1.0 && (0.0 <= local_188)) && (local_188 <= 1.0)))) {
      v2d_generic<float>::operator-(&local_1a0,pos + 2);
      olc::operator*(local_198,&local_184,&local_1a0);
      v2d_generic<float>::operator+(&local_190,pos);
      stack0xfffffffffffffed0 = local_190;
    }
    for (local_1bc = 0; local_1bc < 4; local_1bc = local_1bc + 1) {
      v2d_generic<float>::operator-((v2d_generic<float> *)&q,pos + local_1bc);
      fVar4 = v2d_generic<float>::mag((v2d_generic<float> *)&q);
      (&fStack_1b8)[local_1bc] = fVar4;
    }
    for (local_1c8 = 0; local_1c8 < 4; local_1c8 = local_1c8 + 1) {
      if (((&fStack_1b8)[local_1c8] != 0.0) || (NAN((&fStack_1b8)[local_1c8]))) {
        local_1f0 = ((&fStack_1b8)[local_1c8] + (&fStack_1b8)[(int)(local_1c8 + 2U & 3)]) /
                    (&fStack_1b8)[(int)(local_1c8 + 2U & 3)];
      }
      else {
        local_1f0 = 1.0;
      }
      local_1cc = local_1f0;
      pvVar1 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
               operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                           *)&di.pos.
                              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1c8);
      v2d_generic<float>::operator*=(pvVar1,&local_1cc);
      fVar4 = local_1cc;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &di.uv.
                           super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1c8);
      *pvVar2 = *pvVar2 * fVar4;
      fVar4 = pos[local_1c8].x * (this->vInvScreenSize).x;
      fVar5 = pos[local_1c8].y * (this->vInvScreenSize).y;
      v2d_generic<float>::v2d_generic(&local_1d4,fVar4 + fVar4 + -1.0,-(fVar5 + fVar5 + -1.0));
      pvVar1 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
               operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                           *)&di,(long)local_1c8);
      *pvVar1 = local_1d4;
    }
    di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = this->nDecalMode;
    pvVar3 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                       (&this->vLayers,(ulong)this->nTargetLayer);
    std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
              (&pvVar3->vecDecalInstance,(value_type *)local_a8);
  }
  DecalInstance::~DecalInstance((DecalInstance *)local_a8);
  return;
}

Assistant:

void PixelGameEngine::DrawPartialWarpedDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::vf2d &source_pos, const olc::vf2d &source_size, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.points = 4;
		di.decal = decal;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		olc::vf2d center;
		float rd = ((pos[2].x - pos[0].x) * (pos[3].y - pos[1].y) - (pos[3].x - pos[1].x) * (pos[2].y - pos[0].y));
		if (rd != 0)
		{
			olc::vf2d uvtl = source_pos * decal->vUVScale;
			olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
			di.uv = {{uvtl.x, uvtl.y}, {uvtl.x, uvbr.y}, {uvbr.x, uvbr.y}, {uvbr.x, uvtl.y}};

			rd = 1.0f / rd;
			float rn = ((pos[3].x - pos[1].x) * (pos[0].y - pos[1].y) - (pos[3].y - pos[1].y) * (pos[0].x - pos[1].x)) * rd;
			float sn = ((pos[2].x - pos[0].x) * (pos[0].y - pos[1].y) - (pos[2].y - pos[0].y) * (pos[0].x - pos[1].x)) * rd;
			if (!(rn < 0.f || rn > 1.f || sn < 0.f || sn > 1.f))
				center = pos[0] + rn * (pos[2] - pos[0]);
			float d[4];
			for (int i = 0; i < 4; i++)
				d[i] = (pos[i] - center).mag();
			for (int i = 0; i < 4; i++)
			{
				float q = d[i] == 0.0f ? 1.0f : (d[i] + d[(i + 2) & 3]) / d[(i + 2) & 3];
				di.uv[i] *= q;
				di.w[i] *= q;
				di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			}
			di.mode = nDecalMode;
			vLayers[nTargetLayer].vecDecalInstance.push_back(di);
		}
	}